

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O0

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,Tab tab)

{
  Syntax SVar1;
  char *pcVar2;
  StrWriter *this_local;
  Tab tab_local;
  
  SVar1 = this->style->syntax;
  if (SVar1 == GNU || SVar1 == GNU_MIT) {
    pcVar2 = this->ptr;
    this->ptr = pcVar2 + 1;
    *pcVar2 = ' ';
  }
  else {
    do {
      pcVar2 = this->ptr;
      this->ptr = pcVar2 + 1;
      *pcVar2 = ' ';
    } while (this->ptr < this->base + tab.raw);
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Tab tab)
{
    switch (style.syntax) {

       case Syntax::GNU:
        case Syntax::GNU_MIT:

            *ptr++ = ' ';
            break;

        default:

            do { *ptr++ = ' '; } while (ptr < base + tab.raw);
    }

    return *this;
}